

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsEmpty<Imath_2_5::Vec4<double>>(char *type)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  double *pdVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec4<double>_> b_1;
  Vec4<double> max;
  Vec4<double> min;
  Box<Imath_2_5::Vec4<double>_> b1;
  uint i;
  Vec4<double> p1;
  Vec4<double> p0;
  Box<Imath_2_5::Vec4<double>_> b0;
  Box<Imath_2_5::Vec4<double>_> b;
  Box<Imath_2_5::Vec4<double>_> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  Box<Imath_2_5::Vec4<double>_> *in_stack_fffffffffffffe30;
  Box<Imath_2_5::Vec4<double>_> *in_stack_fffffffffffffe38;
  Vec4<double> local_190;
  Vec4<double> local_170 [3];
  uint local_10c;
  Vec4<double> local_108;
  Vec4<double> local_e8;
  Vec4<double> local_c8;
  Vec4<double> local_a8 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    isEmpty() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec4<double>_>::Box(in_stack_fffffffffffffe20);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec4<double>_>::isEmpty(in_stack_fffffffffffffe38);
  if (!bVar2) {
    __assert_fail("b.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2e8,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec4<double>]"
                 );
  }
  Imath_2_5::Vec4<double>::Vec4(local_a8,-1.0);
  Imath_2_5::Vec4<double>::Vec4(&local_c8,1.0);
  Imath_2_5::Box<Imath_2_5::Vec4<double>_>::Box
            (in_stack_fffffffffffffe30,
             (Vec4<double> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             &in_stack_fffffffffffffe20->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec4<double>_>::isEmpty(in_stack_fffffffffffffe38);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2f3,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec4<double>]"
                 );
  }
  Imath_2_5::Vec4<double>::Vec4(&local_e8);
  Imath_2_5::Vec4<double>::Vec4(&local_108);
  local_10c = 0;
  while( true ) {
    uVar4 = local_10c;
    uVar3 = Imath_2_5::Vec4<double>::dimensions();
    if (uVar3 <= uVar4) break;
    cVar1 = (char)local_10c;
    pdVar6 = Imath_2_5::Vec4<double>::operator[](&local_e8,local_10c);
    *pdVar6 = -(double)(1 << (cVar1 + 1U & 0x1f));
    uVar4 = Imath_2_5::Vec4<double>::dimensions();
    in_stack_fffffffffffffe20 =
         (Box<Imath_2_5::Vec4<double>_> *)(double)(1 << ((char)uVar4 - (char)local_10c & 0x1fU));
    pdVar6 = Imath_2_5::Vec4<double>::operator[](&local_108,local_10c);
    *pdVar6 = (double)in_stack_fffffffffffffe20;
    local_10c = local_10c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec4<double>_>::Box
            (in_stack_fffffffffffffe30,(Vec4<double> *)CONCAT44(uVar4,in_stack_fffffffffffffe28),
             &in_stack_fffffffffffffe20->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec4<double>_>::isEmpty(in_stack_fffffffffffffe38);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x2fd,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec4<double>]"
                 );
  }
  Imath_2_5::Vec4<double>::Vec4(local_170,0.0);
  Imath_2_5::Vec4<double>::Vec4(&local_190,local_170);
  uVar3 = Imath_2_5::Vec4<double>::dimensions();
  pdVar6 = Imath_2_5::Vec4<double>::operator[](&local_190,uVar3 - 1);
  *pdVar6 = 2.0;
  Imath_2_5::Box<Imath_2_5::Vec4<double>_>::Box
            (in_stack_fffffffffffffe30,(Vec4<double> *)CONCAT44(uVar4,in_stack_fffffffffffffe28),
             &in_stack_fffffffffffffe20->min);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec4<double>_>::isEmpty(in_stack_fffffffffffffe38);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x30e,
                  "void (anonymous namespace)::testIsEmpty(const char *) [T = Imath_2_5::Vec4<double>]"
                 );
  }
  return;
}

Assistant:

void
testIsEmpty(const char *type)
{
    cout << "    isEmpty() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.isEmpty());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(!b0.isEmpty());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
           p0[i] = -typename T::BaseType(1 << (i + 1));
           p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(!b1.isEmpty());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.isEmpty());
    }
}